

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionParser::ParseGeneratorExpression
          (cmGeneratorExpressionParser *this,
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          *result)

{
  pointer *this_00;
  pointer *pp_Var1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *pvVar6;
  bool bVar7;
  bool bVar8;
  pointer pcVar9;
  reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  pointer this_01;
  reference contents;
  reference p_Var13;
  GeneratorExpressionContent *pGVar14;
  GeneratorExpressionContent *local_258;
  vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
  local_250;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  local_238;
  GeneratorExpressionContent *local_220;
  GeneratorExpressionContent *content;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_210;
  char *local_208;
  size_t contentLength;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>_>
  local_1f8;
  __normal_iterator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>_>
  local_1f0;
  __normal_iterator<const___gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>_>
  local_1e8;
  const_iterator commaIt;
  __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_1d8;
  const_iterator pend;
  __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_1c8;
  const_iterator pit;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_1b0;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_1a8;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_1a0;
  cmGeneratorExpressionToken *local_198;
  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_190;
  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_188;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_180;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_178;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_170;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_168;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_160;
  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_158;
  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_150;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_148;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_140;
  cmGeneratorExpressionToken *local_138;
  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_130;
  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
  local_128;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_120;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_118;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_110;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_108;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_100;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_f8;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_f0;
  byte local_e1;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  _Stack_e0;
  bool emptyParamTermination;
  const_iterator colonToken;
  vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
  commaTokens;
  vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
  parameters;
  GeneratorExpressionContent *local_a0;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  local_98;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_80;
  GeneratorExpressionContent *local_78;
  GeneratorExpressionContent *content_1;
  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
  local_68 [3];
  cmGeneratorExpressionToken *local_50;
  undefined1 local_48 [8];
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  identifier;
  const_iterator startToken;
  const_iterator cStack_20;
  uint nestedLevel;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_18;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *result_local;
  cmGeneratorExpressionParser *this_local;
  
  local_18 = result;
  result_local = (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *)this;
  cStack_20 = std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
              end(&this->Tokens);
  bVar7 = __gnu_cxx::operator!=(&this->it,&stack0xffffffffffffffe0);
  if (!bVar7) {
    __assert_fail("this->it != this->Tokens.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                  ,0x50,
                  "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                 );
  }
  uVar2 = this->NestingLevel;
  this->NestingLevel = this->NestingLevel + 1;
  identifier.
  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)__gnu_cxx::
                __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                ::operator-(&this->it,1);
  std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
  vector((vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          *)local_48);
  do {
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    bVar7 = false;
    if (pcVar9->TokenType != 2) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
               ::operator->(&this->it);
      bVar7 = pcVar9->TokenType != 3;
    }
    if (!bVar7) break;
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    if (pcVar9->TokenType == 4) {
      local_50 = (this->it)._M_current;
      extendText((vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *)local_48,(const_iterator)local_50);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
      ::operator++(&this->it);
    }
    else {
      ParseContent(this,(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                         *)local_48);
    }
    local_68[0]._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar7 = __gnu_cxx::operator==(&this->it,local_68);
  } while (!bVar7);
  std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
  empty((vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         *)local_48);
  content_1 = (GeneratorExpressionContent *)
              std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
              end(&this->Tokens);
  bVar8 = __gnu_cxx::operator!=
                    (&this->it,
                     (__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                      *)&content_1);
  bVar7 = false;
  if (bVar8) {
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    bVar7 = pcVar9->TokenType == 2;
  }
  if (bVar7) {
    pGVar14 = (GeneratorExpressionContent *)operator_new(0x48);
    this_00 = &identifier.
               super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)this_00);
    pcVar4 = pcVar9->Content;
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    pcVar5 = pcVar9->Content;
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                           *)this_00);
    pcVar3 = pcVar9->Content;
    pcVar9 = __gnu_cxx::
             __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
             ::operator->(&this->it);
    GeneratorExpressionContent::GeneratorExpressionContent
              (pGVar14,pcVar4,(size_t)(pcVar5 + (pcVar9->Length - (long)pcVar3)));
    local_78 = pGVar14;
    local_80._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar7 = __gnu_cxx::operator!=(&this->it,&local_80);
    if (!bVar7) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0x75,
                    "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::operator++(&this->it);
    pGVar14 = local_78;
    this->NestingLevel = this->NestingLevel - 1;
    std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
    ::vector(&local_98,
             (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              *)local_48);
    GeneratorExpressionContent::SetIdentifier(pGVar14,&local_98);
    std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
    ::~vector(&local_98);
    local_a0 = local_78;
    std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
    ::push_back(local_18,(value_type *)&local_a0);
  }
  else {
    std::
    vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
    ::vector((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
              *)&commaTokens.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
    ::vector((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
              *)&colonToken);
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
    ::__normal_iterator(&stack0xffffffffffffff20);
    local_e1 = 0;
    local_f0._M_current =
         (cmGeneratorExpressionToken *)
         std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                   (&this->Tokens);
    bVar8 = __gnu_cxx::operator!=(&this->it,&local_f0);
    bVar7 = false;
    if (bVar8) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
               ::operator->(&this->it);
      bVar7 = pcVar9->TokenType == 3;
    }
    if (bVar7) {
      _Stack_e0._M_current = (this->it)._M_current;
      pp_Var1 = &commaTokens.
                 super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar11 = std::
               vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
               ::size((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       *)pp_Var1);
      std::
      vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
      ::resize((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                *)pp_Var1,sVar11 + 1);
      local_f8._M_current =
           (cmGeneratorExpressionToken *)
           std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                     (&this->Tokens);
      bVar7 = __gnu_cxx::operator!=(&this->it,&local_f8);
      if (!bVar7) {
        __assert_fail("this->it != this->Tokens.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                      ,0x89,
                      "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                     );
      }
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
      ::operator++(&this->it);
      local_100._M_current =
           (cmGeneratorExpressionToken *)
           std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                     (&this->Tokens);
      bVar7 = __gnu_cxx::operator==(&this->it,&local_100);
      if (bVar7) {
        local_e1 = 1;
      }
      while( true ) {
        local_108._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar8 = __gnu_cxx::operator!=(&this->it,&local_108);
        bVar7 = false;
        if (bVar8) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                   ::operator->(&this->it);
          bVar7 = pcVar9->TokenType == 4;
        }
        if (!bVar7) break;
        std::
        vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
        ::push_back((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                     *)&colonToken,&this->it);
        pp_Var1 = &commaTokens.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sVar11 = std::
                 vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                 ::size((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                         *)pp_Var1);
        std::
        vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
        ::resize((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                  *)pp_Var1,sVar11 + 1);
        local_110._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar7 = __gnu_cxx::operator!=(&this->it,&local_110);
        if (!bVar7) {
          __assert_fail("this->it != this->Tokens.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                        ,0x95,
                        "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                       );
        }
        __gnu_cxx::
        __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
        ::operator++(&this->it);
        local_118._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar7 = __gnu_cxx::operator==(&this->it,&local_118);
        if (bVar7) {
          local_e1 = 1;
        }
      }
      while( true ) {
        local_120._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar8 = __gnu_cxx::operator!=(&this->it,&local_120);
        bVar7 = false;
        if (bVar8) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                   ::operator->(&this->it);
          bVar7 = pcVar9->TokenType == 3;
        }
        if (!bVar7) break;
        local_130._M_current =
             (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              *)std::
                vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                ::end((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       *)&commaTokens.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_128 = __gnu_cxx::
                    __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                    ::operator-(&local_130,1);
        pvVar10 = __gnu_cxx::
                  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                  ::operator*(&local_128);
        local_138 = (this->it)._M_current;
        extendText(pvVar10,(const_iterator)local_138);
        local_140._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar7 = __gnu_cxx::operator!=(&this->it,&local_140);
        if (!bVar7) {
          __assert_fail("this->it != this->Tokens.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                        ,0xa0,
                        "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                       );
        }
        __gnu_cxx::
        __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
        ::operator++(&this->it);
      }
      while( true ) {
        local_148._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar8 = __gnu_cxx::operator!=(&this->it,&local_148);
        bVar7 = false;
        if (bVar8) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                   ::operator->(&this->it);
          bVar7 = pcVar9->TokenType != 2;
        }
        if (!bVar7) break;
        local_158._M_current =
             (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              *)std::
                vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                ::end((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       *)&commaTokens.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_150 = __gnu_cxx::
                    __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                    ::operator-(&local_158,1);
        pvVar10 = __gnu_cxx::
                  __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                  ::operator*(&local_150);
        ParseContent(this,pvVar10);
        local_160._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar7 = __gnu_cxx::operator==(&this->it,&local_160);
        if (bVar7) break;
        while( true ) {
          local_168._M_current =
               (cmGeneratorExpressionToken *)
               std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               ::end(&this->Tokens);
          bVar8 = __gnu_cxx::operator!=(&this->it,&local_168);
          bVar7 = false;
          if (bVar8) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                     ::operator->(&this->it);
            bVar7 = pcVar9->TokenType == 4;
          }
          if (!bVar7) break;
          std::
          vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
          ::push_back((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                       *)&colonToken,&this->it);
          pp_Var1 = &commaTokens.
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          sVar11 = std::
                   vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                   ::size((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                           *)pp_Var1);
          std::
          vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
          ::resize((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                    *)pp_Var1,sVar11 + 1);
          local_170._M_current =
               (cmGeneratorExpressionToken *)
               std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               ::end(&this->Tokens);
          bVar7 = __gnu_cxx::operator!=(&this->it,&local_170);
          if (!bVar7) {
            __assert_fail("this->it != this->Tokens.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                          ,0xb0,
                          "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                         );
          }
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
          ::operator++(&this->it);
          local_178._M_current =
               (cmGeneratorExpressionToken *)
               std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               ::end(&this->Tokens);
          bVar7 = __gnu_cxx::operator==(&this->it,&local_178);
          if (bVar7) {
            local_e1 = 1;
          }
        }
        while( true ) {
          local_180._M_current =
               (cmGeneratorExpressionToken *)
               std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               ::end(&this->Tokens);
          bVar8 = __gnu_cxx::operator!=(&this->it,&local_180);
          bVar7 = false;
          if (bVar8) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                     ::operator->(&this->it);
            bVar7 = pcVar9->TokenType == 3;
          }
          if (!bVar7) break;
          local_190._M_current =
               (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                *)std::
                  vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                  ::end((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                         *)&commaTokens.
                            super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_188 = __gnu_cxx::
                      __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                      ::operator-(&local_190,1);
          pvVar10 = __gnu_cxx::
                    __normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                    ::operator*(&local_188);
          local_198 = (this->it)._M_current;
          extendText(pvVar10,(const_iterator)local_198);
          local_1a0._M_current =
               (cmGeneratorExpressionToken *)
               std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               ::end(&this->Tokens);
          bVar7 = __gnu_cxx::operator!=(&this->it,&local_1a0);
          if (!bVar7) {
            __assert_fail("this->it != this->Tokens.end()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                          ,0xbb,
                          "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                         );
          }
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
          ::operator++(&this->it);
        }
      }
      local_1a8._M_current =
           (cmGeneratorExpressionToken *)
           std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::end
                     (&this->Tokens);
      bVar8 = __gnu_cxx::operator!=(&this->it,&local_1a8);
      bVar7 = false;
      if (bVar8) {
        pcVar9 = __gnu_cxx::
                 __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                 ::operator->(&this->it);
        bVar7 = pcVar9->TokenType == 2;
      }
      if (bVar7) {
        this->NestingLevel = this->NestingLevel - 1;
        local_1b0._M_current =
             (cmGeneratorExpressionToken *)
             std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
             end(&this->Tokens);
        bVar7 = __gnu_cxx::operator!=(&this->it,&local_1b0);
        if (!bVar7) {
          __assert_fail("this->it != this->Tokens.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                        ,0xc3,
                        "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                       );
        }
        __gnu_cxx::
        __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
        ::operator++(&this->it);
      }
    }
    if (uVar2 == this->NestingLevel) {
      local_210 = __gnu_cxx::
                  __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                  ::operator-(&this->it,1);
      pcVar9 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
               ::operator->(&local_210);
      pcVar4 = pcVar9->Content;
      pcVar9 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
               ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                             *)&identifier.
                                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar5 = pcVar9->Content;
      content = (GeneratorExpressionContent *)
                __gnu_cxx::
                __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                ::operator-(&this->it,1);
      pcVar9 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
               ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                             *)&content);
      local_208 = pcVar4 + (pcVar9->Length - (long)pcVar5);
      pGVar14 = (GeneratorExpressionContent *)operator_new(0x48);
      pcVar9 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
               ::operator->((__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                             *)&identifier.
                                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      GeneratorExpressionContent::GeneratorExpressionContent
                (pGVar14,pcVar9->Content,(size_t)local_208);
      local_220 = pGVar14;
      std::
      vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
      vector(&local_238,
             (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              *)local_48);
      GeneratorExpressionContent::SetIdentifier(pGVar14,&local_238);
      std::
      vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
      ~vector(&local_238);
      pGVar14 = local_220;
      std::
      vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
      ::vector(&local_250,
               (vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                *)&commaTokens.
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      GeneratorExpressionContent::SetParameters(pGVar14,&local_250);
      std::
      vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
      ::~vector(&local_250);
      local_258 = local_220;
      std::
      vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
      push_back(local_18,(value_type *)&local_258);
    }
    else {
      extendText(local_18,(const_iterator)
                          identifier.
                          super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      extendResult(local_18,(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                             *)local_48);
      bVar7 = std::
              vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
              ::empty((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       *)&commaTokens.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar7) {
        pit._M_current =
             (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              *)_Stack_e0._M_current;
        extendText(local_18,(const_iterator)_Stack_e0._M_current);
        pend._M_current =
             (vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              *)std::
                vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                ::begin((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                         *)&commaTokens.
                            super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>const*,std::vector<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>,std::allocator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>>>
        ::
        __normal_iterator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>*>
                  ((__normal_iterator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>const*,std::vector<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>,std::allocator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>>>
                    *)&local_1c8,
                   (__normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                    *)&pend);
        commaIt._M_current =
             (__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
              *)std::
                vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                ::end((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                       *)&commaTokens.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>const*,std::vector<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>,std::allocator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>>>
        ::
        __normal_iterator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>*>
                  ((__normal_iterator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>const*,std::vector<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>,std::allocator<std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>>>
                    *)&local_1d8,
                   (__normal_iterator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                    *)&commaIt);
        local_1f0._M_current =
             (__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
              *)std::
                vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                ::begin((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                         *)&colonToken);
        __gnu_cxx::
        __normal_iterator<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>const*,std::vector<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>,std::allocator<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>>>>
        ::
        __normal_iterator<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>*>
                  ((__normal_iterator<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>const*,std::vector<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>,std::allocator<__gnu_cxx::__normal_iterator<cmGeneratorExpressionToken_const*,std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>>>>>
                    *)&local_1e8,&local_1f0);
        sVar11 = std::
                 vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                 ::size((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
                         *)&commaTokens.
                            super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar12 = std::
                 vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                 ::size((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                         *)&colonToken);
        if (sVar11 <= sVar12) {
          __assert_fail("parameters.size() > commaTokens.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                        ,0xda,
                        "void cmGeneratorExpressionParser::ParseGeneratorExpression(std::vector<cmGeneratorExpressionEvaluator *> &)"
                       );
        }
        while (bVar7 = __gnu_cxx::operator!=(&local_1c8,&local_1d8), bVar7) {
          this_01 = __gnu_cxx::
                    __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                    ::operator->(&local_1c8);
          bVar7 = std::
                  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  ::empty(this_01);
          pvVar6 = local_18;
          if ((!bVar7) && ((local_e1 & 1) == 0)) {
            contents = __gnu_cxx::
                       __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
                       ::operator*(&local_1c8);
            extendResult(pvVar6,contents);
          }
          local_1f8._M_current =
               (__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>
                *)std::
                  vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                  ::end((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                         *)&colonToken);
          bVar7 = __gnu_cxx::operator!=(&local_1e8,&local_1f8);
          pvVar6 = local_18;
          if (!bVar7) break;
          p_Var13 = __gnu_cxx::
                    __normal_iterator<const___gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>_>
                    ::operator*(&local_1e8);
          contentLength = (size_t)p_Var13->_M_current;
          extendText(pvVar6,(const_iterator)contentLength);
          __gnu_cxx::
          __normal_iterator<const_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_*,_std::vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>_>
          ::operator++(&local_1c8);
          __gnu_cxx::
          __normal_iterator<const___gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_*,_std::vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>_>
          ::operator++(&local_1e8);
        }
      }
    }
    std::
    vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
    ::~vector((vector<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
               *)&colonToken);
    std::
    vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
    ::~vector((vector<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
               *)&commaTokens.
                  super__Vector_base<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_cmGeneratorExpressionToken_*,_std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>::
  ~vector((vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
           *)local_48);
  return;
}

Assistant:

void cmGeneratorExpressionParser::ParseGeneratorExpression(
                        std::vector<cmGeneratorExpressionEvaluator*> &result)
{
  assert(this->it != this->Tokens.end());
  unsigned int nestedLevel = this->NestingLevel;
  ++this->NestingLevel;

  std::vector<cmGeneratorExpressionToken>::const_iterator startToken
                                                              = this->it - 1;

  std::vector<cmGeneratorExpressionEvaluator*> identifier;
  while(this->it->TokenType != cmGeneratorExpressionToken::EndExpression
      && this->it->TokenType != cmGeneratorExpressionToken::ColonSeparator)
    {
    if (this->it->TokenType == cmGeneratorExpressionToken::CommaSeparator)
      {
      extendText(identifier, this->it);
      ++this->it;
      }
    else
      {
      this->ParseContent(identifier);
      }
    if (this->it == this->Tokens.end())
      {
      break;
      }
    }
  if (identifier.empty())
    {
    // ERROR
    }

  if (this->it != this->Tokens.end() &&
      this->it->TokenType == cmGeneratorExpressionToken::EndExpression)
    {
    GeneratorExpressionContent *content = new GeneratorExpressionContent(
                startToken->Content, this->it->Content
                                    - startToken->Content
                                    + this->it->Length);
    assert(this->it != this->Tokens.end());
    ++this->it;
    --this->NestingLevel;
    content->SetIdentifier(identifier);
    result.push_back(content);
    return;
    }

  std::vector<std::vector<cmGeneratorExpressionEvaluator*> > parameters;
  std::vector<std::vector<cmGeneratorExpressionToken>::const_iterator>
                                                            commaTokens;
  std::vector<cmGeneratorExpressionToken>::const_iterator colonToken;

  bool emptyParamTermination = false;

  if (this->it != this->Tokens.end() &&
      this->it->TokenType == cmGeneratorExpressionToken::ColonSeparator)
    {
    colonToken = this->it;
    parameters.resize(parameters.size() + 1);
    assert(this->it != this->Tokens.end());
    ++this->it;
    if(this->it == this->Tokens.end())
      {
      emptyParamTermination = true;
      }

    while (this->it != this->Tokens.end() &&
           this->it->TokenType == cmGeneratorExpressionToken::CommaSeparator)
      {
      commaTokens.push_back(this->it);
      parameters.resize(parameters.size() + 1);
      assert(this->it != this->Tokens.end());
      ++this->it;
      if(this->it == this->Tokens.end())
        {
        emptyParamTermination = true;
        }
      }
    while (this->it != this->Tokens.end() &&
           this->it->TokenType == cmGeneratorExpressionToken::ColonSeparator)
      {
      extendText(*(parameters.end() - 1), this->it);
      assert(this->it != this->Tokens.end());
      ++this->it;
      }
    while (this->it != this->Tokens.end() &&
           this->it->TokenType != cmGeneratorExpressionToken::EndExpression)
      {
      this->ParseContent(*(parameters.end() - 1));
      if (this->it == this->Tokens.end())
        {
        break;
        }
      while (this->it != this->Tokens.end() &&
             this->it->TokenType == cmGeneratorExpressionToken::CommaSeparator)
        {
        commaTokens.push_back(this->it);
        parameters.resize(parameters.size() + 1);
        assert(this->it != this->Tokens.end());
        ++this->it;
        if(this->it == this->Tokens.end())
          {
          emptyParamTermination = true;
          }
        }
      while (this->it != this->Tokens.end() &&
             this->it->TokenType == cmGeneratorExpressionToken::ColonSeparator)
        {
        extendText(*(parameters.end() - 1), this->it);
        assert(this->it != this->Tokens.end());
        ++this->it;
        }
      }
      if(this->it != this->Tokens.end()
          && this->it->TokenType == cmGeneratorExpressionToken::EndExpression)
        {
        --this->NestingLevel;
        assert(this->it != this->Tokens.end());
        ++this->it;
        }
    }

  if (nestedLevel != this->NestingLevel)
  {
    // There was a '$<' in the text, but no corresponding '>'. Rebuild to
    // treat the '$<' as having been plain text, along with the
    // corresponding : and , tokens that might have been found.
    extendText(result, startToken);
    extendResult(result, identifier);
    if (!parameters.empty())
      {
      extendText(result, colonToken);

      typedef std::vector<cmGeneratorExpressionEvaluator*> EvaluatorVector;
      typedef std::vector<cmGeneratorExpressionToken> TokenVector;
      std::vector<EvaluatorVector>::const_iterator pit = parameters.begin();
      const std::vector<EvaluatorVector>::const_iterator pend =
                                                         parameters.end();
      std::vector<TokenVector::const_iterator>::const_iterator commaIt =
                                                         commaTokens.begin();
      assert(parameters.size() > commaTokens.size());
      for ( ; pit != pend; ++pit, ++commaIt)
        {
        if (!pit->empty() && !emptyParamTermination)
          {
          extendResult(result, *pit);
          }
        if (commaIt != commaTokens.end())
          {
          extendText(result, *commaIt);
          }
        else
          {
          break;
          }
        }
      }
    return;
  }

  size_t contentLength = ((this->it - 1)->Content
                    - startToken->Content)
                    + (this->it - 1)->Length;
  GeneratorExpressionContent *content = new GeneratorExpressionContent(
                            startToken->Content, contentLength);
  content->SetIdentifier(identifier);
  content->SetParameters(parameters);
  result.push_back(content);
}